

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<unsigned_int,_QHashDummyValue>_>::rehash
          (Data<QHashPrivate::Node<unsigned_int,_QHashDummyValue>_> *this,size_t sizeHint)

{
  Entry *key;
  uchar *puVar1;
  ulong uVar2;
  Span *pSVar3;
  Node<unsigned_int,_QHashDummyValue> *pNVar4;
  ulong uVar5;
  ulong uVar6;
  size_t index;
  long lVar7;
  size_t numBuckets;
  Span *pSVar8;
  long lVar9;
  R RVar10;
  Bucket BVar11;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if ((0x40 < sizeHint) && (numBuckets = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar7 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar7 ^ 0x3f) & 0x3f);
  }
  uVar2 = this->numBuckets;
  pSVar3 = this->spans;
  RVar10 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar10.spans;
  this->numBuckets = numBuckets;
  if (uVar2 < 0x80) {
    if (pSVar3 == (Span *)0x0) {
      return;
    }
  }
  else {
    uVar5 = 0;
    pSVar8 = pSVar3;
    do {
      lVar7 = 0;
      do {
        if ((ulong)pSVar8->offsets[lVar7] != 0xff) {
          key = pSVar3[uVar5].entries + pSVar8->offsets[lVar7];
          uVar6 = (this->seed >> 0x20 ^ this->seed ^ (ulong)*(uint *)(key->storage).data) *
                  -0x2917014799a6026d;
          uVar6 = (uVar6 >> 0x20 ^ uVar6) * -0x2917014799a6026d;
          BVar11 = findBucketWithHash<unsigned_int>(this,(uint *)key,uVar6 >> 0x20 ^ uVar6);
          pNVar4 = Span<QHashPrivate::Node<unsigned_int,_QHashDummyValue>_>::insert
                             (BVar11.span,BVar11.index);
          pNVar4->key = *(uint *)(key->storage).data;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x80);
      if (pSVar3[uVar5].entries != (Entry *)0x0) {
        operator_delete__(pSVar3[uVar5].entries);
        pSVar3[uVar5].entries = (Entry *)0x0;
      }
      uVar5 = uVar5 + 1;
      pSVar8 = pSVar8 + 1;
    } while (uVar5 != uVar2 >> 7);
  }
  lVar7 = *(long *)&pSVar3[-1].allocated;
  if (lVar7 != 0) {
    lVar9 = lVar7 * 0x90;
    do {
      if (*(void **)(pSVar3->offsets + lVar9 + -0x10) != (void *)0x0) {
        operator_delete__(*(void **)(pSVar3->offsets + lVar9 + -0x10));
        puVar1 = pSVar3->offsets + lVar9 + -0x10;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
      }
      lVar9 = lVar9 + -0x90;
    } while (lVar9 != 0);
  }
  operator_delete__(&pSVar3[-1].allocated,lVar7 * 0x90 + 8);
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }